

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::lts_20250127::LogSink_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>::
EmplaceBack<absl::lts_20250127::LogSink*const&>
          (Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
           *this,LogSink **args)

{
  allocator<absl::lts_20250127::LogSink_*> *__a;
  Pointer<std::allocator<absl::lts_20250127::LogSink_*>_> last_ptr;
  SizeType<std::allocator<absl::lts_20250127::LogSink_*>_> n;
  StorageView<std::allocator<absl::lts_20250127::LogSink_*>_> storage_view;
  LogSink **args_local;
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
  *this_local;
  
  storage_view.capacity = (SizeType<std::allocator<absl::lts_20250127::LogSink_*>_>)args;
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  MakeStorageView((StorageView<std::allocator<absl::lts_20250127::LogSink_*>_> *)&n,
                  (Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                   *)this);
  if (storage_view.data ==
      (Pointer<std::allocator<absl::lts_20250127::LogSink_*>_>)storage_view.size) {
    this_local = (Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                  *)EmplaceBackSlow<absl::lts_20250127::LogSink*const&>
                              (this,(LogSink **)storage_view.capacity);
  }
  else {
    this_local = (Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                  *)(n + (long)storage_view.data * 8);
    __a = Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
          ::GetAllocator((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                          *)this);
    std::allocator_traits<std::allocator<absl::lts_20250127::LogSink*>>::
    construct<absl::lts_20250127::LogSink*,absl::lts_20250127::LogSink*const&>
              (__a,(LogSink **)this_local,(LogSink **)storage_view.capacity);
    Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
    AddSize((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
             *)this,1);
  }
  return (Reference<std::allocator<absl::lts_20250127::LogSink_*>_>)this_local;
}

Assistant:

auto Storage<T, N, A>::EmplaceBack(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  const SizeType<A> n = storage_view.size;
  if (ABSL_PREDICT_TRUE(n != storage_view.capacity)) {
    // Fast path; new element fits.
    Pointer<A> last_ptr = storage_view.data + n;
    AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                  std::forward<Args>(args)...);
    AddSize(1);
    return *last_ptr;
  }
  // TODO(b/173712035): Annotate with musttail attribute to prevent regression.
  return EmplaceBackSlow(std::forward<Args>(args)...);
}